

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ULONG __thiscall Js::FunctionBody::GetSourceLineNumber(FunctionBody *this,uint statementIndex)

{
  uint startCharOfStatement;
  ULONG local_1c [2];
  ULONG line;
  
  local_1c[0] = 0;
  if (statementIndex != 0xffffffff) {
    startCharOfStatement = GetStartOffset(this,statementIndex);
    if (statementIndex == 0 || startCharOfStatement != 0) {
      GetLineCharOffsetFromStartChar(this,startCharOfStatement,local_1c,(LONG *)0x0,false);
      local_1c[0] = local_1c[0] + 1;
    }
  }
  return local_1c[0];
}

Assistant:

ULONG FunctionBody::GetSourceLineNumber(uint statementIndex)
    {
        ULONG line = 0;
        if (statementIndex != Js::Constants::NoStatementIndex)
        {
            uint startOffset = GetStartOffset(statementIndex);

            if (startOffset != 0 || statementIndex == 0)
            {
                GetLineCharOffsetFromStartChar(startOffset, &line, nullptr, false /*canAllocateLineCache*/);
                line = line + 1;
            }
        }

        return line;
    }